

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

_Bool get_commasep_word(ptrlen *list,ptrlen *word)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar4 = list->len;
  if (sVar4 == 0) {
    return false;
  }
  pvVar1 = list->ptr;
  lVar2 = -1;
  sVar5 = 0;
  do {
    if (*(char *)((long)pvVar1 + sVar5) != ',') {
      pvVar3 = memchr((void *)((long)pvVar1 + sVar5),0x2c,sVar4 - sVar5);
      if (pvVar3 == (void *)0x0) {
        sVar4 = list->len;
        word->ptr = list->ptr;
        word->len = sVar4;
        sVar4 = 0;
      }
      else {
        word->ptr = (void *)((long)pvVar1 + sVar5);
        word->len = (long)pvVar3 + (-sVar5 - (long)pvVar1);
        list->ptr = (void *)((long)pvVar3 + (long)list->ptr + (-sVar5 - (long)pvVar1) + 1);
        sVar4 = (long)pvVar1 + sVar5 + (list->len - (long)pvVar3) + -1;
      }
      list->len = sVar4;
      return true;
    }
    list->ptr = (void *)((long)pvVar1 + sVar5 + 1);
    list->len = sVar4 + lVar2;
    sVar5 = sVar5 + 1;
    lVar2 = lVar2 + -1;
  } while (sVar4 != sVar5);
  return false;
}

Assistant:

bool get_commasep_word(ptrlen *list, ptrlen *word)
{
    const char *comma;

    /*
     * Discard empty list elements, should there be any, because we
     * never want to return one as if it was a real string. (This
     * introduces a mild tolerance of badly formatted data in lists we
     * receive, but I think that's acceptable.)
     */
    while (list->len > 0 && *(const char *)list->ptr == ',') {
        list->ptr = (const char *)list->ptr + 1;
        list->len--;
    }

    if (!list->len)
        return false;

    comma = memchr(list->ptr, ',', list->len);
    if (!comma) {
        *word = *list;
        list->len = 0;
    } else {
        size_t wordlen = comma - (const char *)list->ptr;
        word->ptr = list->ptr;
        word->len = wordlen;
        list->ptr = (const char *)list->ptr + wordlen + 1;
        list->len -= wordlen + 1;
    }
    return true;
}